

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintTools.h
# Opt level: O1

void PrintTools::PrintProgress<char_const*>(char *prefix,LIndex i,LIndex nr,size_t interval)

{
  size_t sVar1;
  ostream *poVar2;
  double dVar3;
  double dVar4;
  
  if ((interval < i) && (i % interval == 0)) {
    if (prefix == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x5f93b0);
    }
    else {
      sVar1 = strlen(prefix);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,prefix,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    poVar2 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," of ",4);
    poVar2 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," - ",3);
    *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 8) = 4;
    dVar3 = Globals::CastLIndexToDouble(i);
    dVar4 = Globals::CastLIndexToDouble(nr);
    poVar2 = std::ostream::_M_insert<double>((dVar3 / dVar4) * 100.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"%",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

static void PrintProgress(T prefix, LIndex i,
                   LIndex nr, size_t interval)
{
    if(i % interval == 0&& i > interval)
    {
        std::cout << prefix << " "<< i << " of " << nr << " - "
                  << std::setprecision(4)
                  << (CastLIndexToDouble(i) / CastLIndexToDouble(nr)) * 100
                  << "%" << std::endl;
    }
}